

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printChannelList(ChannelList *cl)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  Channel *pCVar4;
  ConstIterator i;
  ConstIterator *in_stack_ffffffffffffffc8;
  ostream *in_stack_ffffffffffffffd0;
  
  Imf_3_2::ChannelList::begin();
  while( true ) {
    Imf_3_2::ChannelList::end();
    bVar1 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8
                               );
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 = std::operator<<((ostream *)&std::cout,"\n    ");
    pcVar2 = Imf_3_2::ChannelList::ConstIterator::name((ConstIterator *)0x104da1);
    poVar3 = std::operator<<(in_stack_ffffffffffffffd0,pcVar2);
    std::operator<<(poVar3,", ");
    Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x104dc7);
    printPixelType(UINT);
    poVar3 = std::operator<<((ostream *)&std::cout,", sampling ");
    pCVar4 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x104df0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(pCVar4 + 4));
    poVar3 = std::operator<<(poVar3," ");
    pCVar4 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x104e1b);
    std::ostream::operator<<(poVar3,*(int *)(pCVar4 + 8));
    pCVar4 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x104e32);
    if (((byte)pCVar4[0xc] & 1) != 0) {
      std::operator<<((ostream *)&std::cout,", plinear");
    }
    Imf_3_2::ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void
printChannelList (const ChannelList& cl)
{
    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
    {
        cout << "\n    " << i.name () << ", ";

        printPixelType (i.channel ().type);

        cout << ", sampling " << i.channel ().xSampling << " "
             << i.channel ().ySampling;

        if (i.channel ().pLinear) cout << ", plinear";
    }
}